

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O0

object * __thiscall pybind11::object::operator=(object *this,object *other)

{
  handle local_20;
  handle temp;
  object *other_local;
  object *this_local;
  
  if (this != other) {
    temp.m_ptr = (PyObject *)other;
    handle::handle<_object_*,_0>(&local_20,(this->super_handle).m_ptr);
    (this->super_handle).m_ptr = (PyObject *)(temp.m_ptr)->ob_refcnt;
    (temp.m_ptr)->ob_refcnt = 0;
    handle::dec_ref(&local_20);
  }
  return this;
}

Assistant:

object &operator=(object &&other) noexcept {
        if (this != &other) {
            handle temp(m_ptr);
            m_ptr = other.m_ptr;
            other.m_ptr = nullptr;
            temp.dec_ref();
        }
        return *this;
    }